

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O1

void * raviX_ptrlist_iter_prev(PtrListIterator *self)

{
  undefined4 uVar1;
  PtrList *pPVar2;
  void *pvVar3;
  uint uVar4;
  
  if (self->__head == (PtrList *)0x0) {
    return (void *)0x0;
  }
  uVar4 = self->__nr - 1;
  self->__nr = uVar4;
  do {
    while ((int)uVar4 < 0) {
LAB_0010b868:
      pPVar2 = self->__list->prev_;
      if (pPVar2 == self->__head) {
        return (void *)0x0;
      }
      self->__list = pPVar2;
      uVar4 = (int)*(char *)pPVar2 - 1;
      self->__nr = uVar4;
    }
    uVar1 = *(undefined4 *)self->__list;
    if ((int)(char)uVar1 <= (int)uVar4) goto LAB_0010b868;
    pvVar3 = self->__list->list_[uVar4];
    if (pvVar3 != (void *)0x0 || (ushort)uVar1 < 0x100) {
      return pvVar3;
    }
    uVar4 = uVar4 - 1;
    self->__nr = uVar4;
  } while( true );
}

Assistant:

void *raviX_ptrlist_iter_prev(PtrListIterator *self)
{
	if (self->__head == NULL)
		return NULL;
	self->__nr--;
Lretry:
	if (self->__nr >= 0 && self->__nr < self->__list->nr_) {
		void *ptr = self->__list->list_[self->__nr];
		if (self->__list->rm_ && !ptr) {
			self->__nr--;
			goto Lretry;
		}
		return ptr;
	} else if (self->__list->prev_ != self->__head) {
		self->__list = self->__list->prev_;
		self->__nr = self->__list->nr_ - 1;
		goto Lretry;
	}
	return NULL;
}